

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> * __thiscall
dg::dda::MemorySSATransformation::findDefinitions
          (MemorySSATransformation *this,RWBBlock *block,DefSite *ds)

{
  _Rb_tree_const_iterator<dg::dda::RWNode_*> __first;
  iterator __last;
  iterator this_00;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_RDI;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *in_stack_00000020;
  DefSite *in_stack_00000028;
  Definitions *in_stack_00000030;
  RWBBlock *in_stack_00000038;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> defSet;
  Definitions *D;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *defs;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_ffffffffffffff68;
  DefSite *in_stack_ffffffffffffff88;
  RWBBlock *in_stack_ffffffffffffff90;
  MemorySSATransformation *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar1;
  
  getBBlockDefinitions
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Definitions::get((Definitions *)in_stack_ffffffffffffff98,(DefSite *)in_stack_ffffffffffffff90);
  uVar1 = 0;
  __last = std::
           set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           ::begin(in_stack_ffffffffffffff68);
  this_00 = std::
            set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            ::end(in_stack_ffffffffffffff68);
  std::allocator<dg::dda::RWNode_*>::allocator((allocator<dg::dda::RWNode_*> *)0x173e16);
  __first._M_node._7_1_ = uVar1;
  __first._M_node._0_7_ = in_stack_ffffffffffffffa0;
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  vector<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
            ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)this_00._M_node,
             __first,(_Rb_tree_const_iterator<dg::dda::RWNode_*>)__last._M_node,
             (allocator_type *)in_stack_ffffffffffffff88);
  std::allocator<dg::dda::RWNode_*>::~allocator((allocator<dg::dda::RWNode_*> *)0x173e39);
  addUncoveredFromPredecessors
            ((MemorySSATransformation *)defSet._M_t._M_impl._0_8_,in_stack_00000038,
             in_stack_00000030,in_stack_00000028,in_stack_00000020);
  std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
  ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
       0x173e7a);
  return in_RDI;
}

Assistant:

std::vector<RWNode *>
MemorySSATransformation::findDefinitions(RWBBlock *block, const DefSite &ds) {
    assert(ds.target && "Target is null");
    assert(block && "Block is null");

    // Find known definitions.
    auto &D = getBBlockDefinitions(block, &ds);
    auto defSet = D.get(ds);
    assert((!defSet.empty() || D.unknownWrites.empty()) &&
           "BUG: if we found no definitions, also unknown writes must be "
           "empty");
    std::vector<RWNode *> defs(defSet.begin(), defSet.end());

    addUncoveredFromPredecessors(block, D, ds, defs);

    return defs;
}